

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O2

Test * __thiscall
testing::internal::
TestFactoryImpl<(anonymous_namespace)::SingleEvaluationTest_FailedEXPECT_THROW_MSG_Test>::CreateTest
          (TestFactoryImpl<(anonymous_namespace)::SingleEvaluationTest_FailedEXPECT_THROW_MSG_Test>
           *this)

{
  Test *this_00;
  
  this_00 = (Test *)operator_new(0x10);
  anon_unknown.dwarf_3aa4::SingleEvaluationTest::SingleEvaluationTest
            ((SingleEvaluationTest *)this_00);
  ((Test *)&this_00->_vptr_Test)->_vptr_Test = (_func_int **)&PTR__Test_0016a0b0;
  return this_00;
}

Assistant:

virtual Test* CreateTest() { return new TestClass; }